

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O2

void SUNBandMatrix_Print(SUNMatrix A,FILE *outfile)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  SUNMatrix_ID SVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  long local_48;
  
  SVar5 = SUNMatGetID(A);
  if (SVar5 == SUNMATRIX_BAND) {
    fputc(10,(FILE *)outfile);
    local_48 = 0;
    for (lVar11 = 0; piVar3 = (int *)A->content, lVar11 < *piVar3; lVar11 = lVar11 + 1) {
      iVar1 = piVar3[1];
      iVar2 = piVar3[3];
      iVar10 = (int)lVar11;
      uVar7 = iVar10 - piVar3[4];
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      uVar8 = (ulong)uVar7;
      uVar7 = iVar10 - piVar3[4];
      uVar6 = 0;
      if (0 < (int)uVar7) {
        uVar6 = uVar7;
      }
      while (bVar12 = uVar6 != 0, uVar6 = uVar6 - 1, bVar12) {
        fprintf((FILE *)outfile,"%12s  ","");
      }
      iVar4 = iVar1 + -1;
      if (iVar2 + iVar10 < iVar1) {
        iVar4 = iVar2 + iVar10;
      }
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      lVar9 = local_48 + (ulong)uVar7 * -8;
      for (; (long)uVar8 <= (long)iVar4; uVar8 = uVar8 + 1) {
        fprintf((FILE *)outfile,"%12g  ",
                *(undefined8 *)
                 (lVar9 + (long)*(int *)((long)A->content + 0x14) * 8 +
                          *(long *)(*(long *)((long)A->content + 0x28) + uVar8 * 8)));
        lVar9 = lVar9 + -8;
      }
      fputc(10,(FILE *)outfile);
      local_48 = local_48 + 8;
    }
    fputc(10,(FILE *)outfile);
    return;
  }
  return;
}

Assistant:

void SUNBandMatrix_Print(SUNMatrix A, FILE* outfile)
{
  sunindextype i, j, start, finish;

  /* should not be called unless A is a band matrix;
     otherwise return immediately */
  if (SUNMatGetID(A) != SUNMATRIX_BAND)
    return;

  /* perform operation */
  fprintf(outfile,"\n");
  for (i=0; i<SM_ROWS_B(A); i++) {
    start = SUNMAX(0, i-SM_LBAND_B(A));
    finish = SUNMIN(SM_COLUMNS_B(A)-1, i+SM_UBAND_B(A));
    for (j=0; j<start; j++)
      fprintf(outfile,"%12s  ","");
    for (j=start; j<=finish; j++) {
#if defined(SUNDIALS_EXTENDED_PRECISION)
      fprintf(outfile,"%12Lg  ", SM_ELEMENT_B(A,i,j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      fprintf(outfile,"%12g  ", SM_ELEMENT_B(A,i,j));
#else
      fprintf(outfile,"%12g  ", SM_ELEMENT_B(A,i,j));
#endif
    }
    fprintf(outfile,"\n");
  }
  fprintf(outfile,"\n");
  return;
}